

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O3

void gen_stfs(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx_00;
  TCGContext_conflict10 *tcg_ctx_01;
  uint uVar2;
  TCGTemp *pTVar3;
  uintptr_t o_1;
  TCGv_i64 arg2;
  TCGv_i64 pTVar4;
  TCGContext_conflict10 *tcg_ctx;
  TCGOpcode opc;
  uintptr_t o_4;
  uintptr_t o;
  TCGv_i64 ret;
  
  if (ctx->fpu_enabled == false) {
    gen_exception(ctx,7);
    return;
  }
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->need_access_type == true) && (ctx->access_type != 0x30)) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)tcg_ctx_00),0x30
                     );
    ctx->access_type = 0x30;
  }
  pTVar3 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar3 - (long)tcg_ctx_00);
  pTVar3 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  tcg_ctx_01 = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  arg2 = (TCGv_i64)(long)(short)uVar1;
  uVar2 = uVar1 >> 0x10 & 0x1f;
  if (uVar2 == 0) {
    pTVar4 = (TCGv_i64)((ulong)arg2 & 0xffffffff);
    if (ctx->sf_mode != false) {
      pTVar4 = arg2;
    }
    opc = INDEX_op_movi_i64;
LAB_00b9ca0c:
    tcg_gen_op2_ppc64(tcg_ctx_01,opc,(TCGArg)(ret + (long)tcg_ctx_01),(TCGArg)pTVar4);
  }
  else {
    if ((uVar1 & 0xffff) == 0) {
      pTVar4 = cpu_gpr[uVar2];
      if (ctx->sf_mode != false) {
        if (pTVar4 == ret) goto LAB_00b9ca11;
        pTVar4 = pTVar4 + (long)tcg_ctx_01;
        opc = INDEX_op_mov_i64;
        goto LAB_00b9ca0c;
      }
    }
    else {
      tcg_gen_addi_i64_ppc64(tcg_ctx_01,ret,cpu_gpr[uVar2],(int64_t)arg2);
      pTVar4 = ret;
      if (ctx->sf_mode != false) goto LAB_00b9ca11;
    }
    tcg_gen_ext32u_i64_ppc64(tcg_ctx_01,ret,pTVar4);
  }
LAB_00b9ca11:
  tcg_gen_op3_ppc64(tcg_ctx_00,INDEX_op_ld_i64,(TCGArg)pTVar3,
                    (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),
                    (ulong)(ctx->opcode >> 0x11 & 0x1f0) + 0x12b28);
  gen_qemu_st32fs(ctx,(TCGv_i64)((long)pTVar3 - (long)tcg_ctx_00),ret);
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(ret + (long)tcg_ctx_00));
  tcg_temp_free_internal_ppc64
            (tcg_ctx_00,(TCGTemp *)((TCGv_i64)((long)pTVar3 - (long)tcg_ctx_00) + (long)tcg_ctx_00))
  ;
  return;
}

Assistant:

static void gen_stfdepx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 t0;
    CHK_SV;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    gen_set_access_type(ctx, ACCESS_FLOAT);
    EA = tcg_temp_new(tcg_ctx);
    t0 = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    get_fpr(tcg_ctx, t0, rD(ctx->opcode));
    tcg_gen_qemu_st_i64(tcg_ctx, t0, EA, PPC_TLB_EPID_STORE, DEF_MEMOP(MO_Q));
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, t0);
}